

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_bufferMode_e ZVar1;
  ZSTD_cStreamStage ZVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  size_t err_code;
  size_t sVar7;
  ulong uVar8;
  void *pvVar9;
  ulong uVar10;
  bool bVar11;
  char *dst;
  void *pvVar12;
  char *dst_00;
  size_t sVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  size_t sStack_90;
  size_t local_78;
  void *local_70;
  char *local_60;
  
  if (output->size < output->pos) {
    sStack_90 = 0xffffffffffffffba;
    local_78 = sStack_90;
  }
  else {
    uVar8 = input->size;
    uVar10 = input->pos;
    if (uVar8 < uVar10) {
      sStack_90 = 0xffffffffffffffb8;
      local_78 = sStack_90;
    }
    else if (endOp < (ZSTD_e_end|ZSTD_e_flush)) {
      if (cctx == (ZSTD_CCtx *)0x0) {
        __assert_fail("cctx != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x68fc,
                      "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
      local_78 = 0xffffffffffffffce;
      if (cctx->streamStage == zcss_init) {
        sVar13 = (uVar8 - uVar10) + cctx->stableIn_notConsumed;
        if (((endOp == ZSTD_e_continue) && ((cctx->requestedParams).inBufferMode == ZSTD_bm_stable))
           && (sVar13 < 0x20000)) {
          if (cctx->stableIn_notConsumed != 0) {
            if (input->src != (cctx->expectedInBuffer).src) {
              return 0xffffffffffffffce;
            }
            if (uVar10 != (cctx->expectedInBuffer).size) {
              return 0xffffffffffffffce;
            }
          }
          input->pos = uVar8;
          (cctx->expectedInBuffer).pos = uVar8;
          sVar7 = input->size;
          (cctx->expectedInBuffer).src = input->src;
          (cctx->expectedInBuffer).size = sVar7;
          cctx->stableIn_notConsumed = sVar13;
          return (ulong)((cctx->requestedParams).format == ZSTD_f_zstd1) * 4 + 2;
        }
        sVar13 = ZSTD_CCtx_init_compressStream2(cctx,endOp,sVar13);
        if (0xffffffffffffff88 < sVar13) {
          return sVar13;
        }
        ZSTD_setBufferExpectations(cctx,output,input);
      }
      ZVar1 = (cctx->appliedParams).inBufferMode;
      if (((ZVar1 != ZSTD_bm_stable) ||
          (((cctx->expectedInBuffer).src == input->src &&
           ((cctx->expectedInBuffer).pos == input->pos)))) &&
         (((cctx->appliedParams).outBufferMode != ZSTD_bm_stable ||
          (cctx->expectedOutBufferSize == output->size - output->pos)))) {
        if ((cctx->appliedParams).nbWorkers < 1) {
          pvVar3 = input->src;
          if (pvVar3 == (void *)0x0) {
            local_70 = (void *)0x0;
            pvVar12 = (void *)0x0;
          }
          else {
            local_70 = (void *)(input->size + (long)pvVar3);
            pvVar12 = (void *)(input->pos + (long)pvVar3);
          }
          pvVar6 = output->dst;
          if (pvVar6 == (void *)0x0) {
            local_60 = (char *)0x0;
            dst = (char *)0x0;
          }
          else {
            local_60 = (char *)(output->size + (long)pvVar6);
            dst = (char *)(output->pos + (long)pvVar6);
          }
          if (ZVar1 == ZSTD_bm_buffered) {
            if (cctx->inBuff == (char *)0x0) {
              __assert_fail("zcs->inBuff != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x67b7,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
            if (cctx->inBuffSize == 0) {
              __assert_fail("zcs->inBuffSize > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x67b8,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
          }
          else if (ZVar1 == ZSTD_bm_stable) {
            uVar8 = cctx->stableIn_notConsumed;
            if (input->pos < uVar8) {
              __assert_fail("input->pos >= zcs->stableIn_notConsumed",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x67b1,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
            input->pos = input->pos - uVar8;
            pvVar12 = (void *)((long)pvVar12 - uVar8);
            cctx->stableIn_notConsumed = 0;
          }
          if ((cctx->appliedParams).outBufferMode == ZSTD_bm_buffered) {
            if (cctx->outBuff == (char *)0x0) {
              __assert_fail("zcs->outBuff != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x67bb,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
            if (cctx->outBuffSize == 0) {
              __assert_fail("zcs->outBuffSize > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x67bc,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
          }
          uVar8 = input->size;
          if (pvVar3 == (void *)0x0) {
            if (uVar8 != 0) {
              __assert_fail("input->size == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x67be,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
            uVar8 = 0;
          }
          if (uVar8 < input->pos) {
            __assert_fail("input->pos <= input->size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x67bf,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
          uVar8 = output->size;
          if (pvVar6 == (void *)0x0) {
            if (uVar8 != 0) {
              __assert_fail("output->size == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x67c0,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
            uVar8 = 0;
          }
          if (uVar8 < output->pos) {
            __assert_fail("output->pos <= output->size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x67c1,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
          bVar15 = false;
LAB_0019600b:
          while( true ) {
            if (bVar15) {
              input->pos = (long)pvVar12 - (long)pvVar3;
              output->pos = (long)dst - (long)pvVar6;
              if ((cctx->frameEnded == 0) &&
                 (sVar13 = ZSTD_nextInputSizeHint(cctx), 0xffffffffffffff88 < sVar13)) {
                return sVar13;
              }
              ZSTD_setBufferExpectations(cctx,output,input);
              return cctx->outBuffContentSize - cctx->outBuffFlushedSize;
            }
            ZVar2 = cctx->streamStage;
            if (ZVar2 == zcss_load) break;
            if (ZVar2 != zcss_flush) {
              if (ZVar2 == zcss_init) {
                return 0xffffffffffffffc2;
              }
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x684f,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
LAB_001963a3:
            if ((cctx->appliedParams).outBufferMode != ZSTD_bm_buffered) {
              __assert_fail("zcs->appliedParams.outBufferMode == ZSTD_bm_buffered",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x6834,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
            sVar13 = cctx->outBuffFlushedSize;
            uVar14 = cctx->outBuffContentSize - sVar13;
            uVar10 = (long)local_60 - (long)dst;
            uVar8 = uVar14;
            if (uVar10 < uVar14) {
              uVar8 = uVar10;
            }
            if (uVar8 != 0) {
              memcpy(dst,cctx->outBuff + sVar13,uVar8);
              sVar13 = cctx->outBuffFlushedSize;
            }
            dst = dst + uVar8;
            cctx->outBuffFlushedSize = sVar13 + uVar8;
            if (uVar10 < uVar14) {
              bVar15 = true;
              if (dst != local_60) {
                __assert_fail("op==oend",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x683f,
                              "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                             );
              }
            }
            else {
              cctx->outBuffContentSize = 0;
              cctx->outBuffFlushedSize = 0;
              if (cctx->frameEnded != 0) goto LAB_00196461;
              cctx->streamStage = zcss_load;
              bVar15 = false;
            }
          }
          if (endOp == ZSTD_e_end) {
            sVar13 = ZSTD_compressBound((long)local_70 - (long)pvVar12);
            if (((sVar13 <= (ulong)((long)local_60 - (long)dst)) ||
                ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable)) && (cctx->inBuffPos == 0))
            {
              sVar13 = ZSTD_compressEnd_public
                                 (cctx,dst,(long)local_60 - (long)dst,pvVar12,
                                  (long)local_70 - (long)pvVar12);
              if (0xffffffffffffff88 < sVar13) {
                return sVar13;
              }
              cctx->streamStage = zcss_init;
              cctx->frameEnded = 1;
              cctx->pledgedSrcSizePlusOne = 0;
              dst = dst + sVar13;
              bVar15 = true;
              pvVar12 = local_70;
              goto LAB_0019600b;
            }
          }
          ZVar1 = (cctx->appliedParams).inBufferMode;
          pvVar9 = pvVar12;
          if (ZVar1 == ZSTD_bm_stable) {
            if (endOp == ZSTD_e_flush) {
              bVar15 = true;
              if (pvVar12 == local_70) goto LAB_0019600b;
            }
            else if (endOp == ZSTD_e_continue) {
              if (cctx->blockSize <= (ulong)((long)local_70 - (long)pvVar12)) goto LAB_0019616a;
              cctx->stableIn_notConsumed = (long)local_70 - (long)pvVar12;
              bVar15 = true;
              pvVar12 = local_70;
              goto LAB_0019600b;
            }
            sVar13 = (long)local_60 - (long)dst;
LAB_0019617e:
            uVar8 = (long)local_70 - (long)pvVar9;
            if (cctx->blockSize <= (ulong)((long)local_70 - (long)pvVar9)) {
              uVar8 = cctx->blockSize;
            }
            bVar15 = false;
            pvVar12 = pvVar9;
          }
          else {
            if (ZVar1 != ZSTD_bm_buffered) {
              __assert_fail("zcs->appliedParams.inBufferMode == ZSTD_bm_stable",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x67ed,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
            sVar13 = cctx->inBuffPos;
            uVar10 = cctx->inBuffTarget - sVar13;
            uVar8 = (long)local_70 - (long)pvVar12;
            if (uVar10 < (ulong)((long)local_70 - (long)pvVar12)) {
              uVar8 = uVar10;
            }
            if (uVar8 != 0) {
              memcpy(cctx->inBuff + sVar13,pvVar12,uVar8);
              sVar13 = cctx->inBuffPos;
            }
            uVar10 = sVar13 + uVar8;
            cctx->inBuffPos = uVar10;
            pvVar9 = (void *)(uVar8 + (long)pvVar12);
            if (pvVar12 == (void *)0x0) {
              pvVar9 = pvVar12;
            }
            pvVar12 = pvVar9;
            if (endOp == ZSTD_e_flush) {
              bVar15 = true;
              if (uVar10 == cctx->inToCompress) goto LAB_0019600b;
            }
            else if ((endOp == ZSTD_e_continue) && (bVar15 = true, uVar10 < cctx->inBuffTarget))
            goto LAB_0019600b;
LAB_0019616a:
            sVar13 = (long)local_60 - (long)dst;
            if ((cctx->appliedParams).inBufferMode != ZSTD_bm_buffered) goto LAB_0019617e;
            uVar8 = cctx->inBuffPos - cctx->inToCompress;
            bVar15 = true;
            pvVar12 = pvVar9;
          }
          sVar7 = ZSTD_compressBound(uVar8);
          dst_00 = dst;
          if ((sVar13 < sVar7) && ((cctx->appliedParams).outBufferMode != ZSTD_bm_stable)) {
            sVar13 = cctx->outBuffSize;
            dst_00 = cctx->outBuff;
          }
          if (bVar15) {
            bVar15 = endOp == ZSTD_e_end;
            bVar16 = pvVar12 == local_70;
            bVar11 = bVar16 && bVar15;
            if (bVar16 && bVar15) {
              uVar8 = ZSTD_compressEnd_public
                                (cctx,dst_00,sVar13,cctx->inBuff + cctx->inToCompress,uVar8);
            }
            else {
              uVar8 = ZSTD_compressContinue_public
                                (cctx,dst_00,sVar13,cctx->inBuff + cctx->inToCompress,uVar8);
            }
            if (0xffffffffffffff88 < uVar8) {
              return uVar8;
            }
            cctx->frameEnded = (uint)bVar11;
            sVar13 = cctx->inBuffPos;
            sVar7 = cctx->blockSize;
            uVar10 = sVar7 + sVar13;
            cctx->inBuffTarget = uVar10;
            if (cctx->inBuffSize < uVar10) {
              cctx->inBuffPos = 0;
              cctx->inBuffTarget = sVar7;
              sVar13 = 0;
              uVar10 = sVar7;
            }
            if ((!bVar16 || !bVar15) && cctx->inBuffSize < uVar10) {
              __assert_fail("zcs->inBuffTarget <= zcs->inBuffSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x6817,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
            cctx->inToCompress = sVar13;
          }
          else {
            pvVar9 = (void *)((long)pvVar12 + uVar8);
            bVar11 = pvVar9 == local_70 && endOp == ZSTD_e_end;
            if (pvVar9 == local_70 && endOp == ZSTD_e_end) {
              uVar8 = ZSTD_compressEnd_public(cctx,dst_00,sVar13,pvVar12,uVar8);
            }
            else {
              uVar8 = ZSTD_compressContinue_public(cctx,dst_00,sVar13,pvVar12,uVar8);
            }
            if (0xffffffffffffff88 < uVar8) {
              return uVar8;
            }
            if (pvVar12 == (void *)0x0) {
              pvVar9 = pvVar12;
            }
            pvVar12 = pvVar9;
            cctx->frameEnded = (uint)bVar11;
            if (pvVar12 != local_70 && bVar11) {
              __assert_fail("ip == iend",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x6822,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
          }
          if (dst_00 != dst) {
            cctx->outBuffContentSize = uVar8;
            cctx->outBuffFlushedSize = 0;
            cctx->streamStage = zcss_flush;
            goto LAB_001963a3;
          }
          dst = dst + uVar8;
          bVar15 = false;
          if (bVar11) {
LAB_00196461:
            cctx->streamStage = zcss_init;
            cctx->pledgedSrcSizePlusOne = 0;
            bVar15 = true;
          }
          goto LAB_0019600b;
        }
        if (cctx->cParamsChanged != 0) {
          ZSTDMT_updateCParams_whileCompressing(cctx->mtctx,&cctx->requestedParams);
          cctx->cParamsChanged = 0;
        }
        uVar8 = cctx->stableIn_notConsumed;
        if (uVar8 == 0) {
          sVar13 = input->pos;
        }
        else {
          if ((cctx->appliedParams).inBufferMode != ZSTD_bm_stable) {
            __assert_fail("cctx->appliedParams.inBufferMode == ZSTD_bm_stable",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x6922,
                          "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                         );
          }
          sVar13 = input->pos - uVar8;
          if (input->pos < uVar8) {
            __assert_fail("input->pos >= cctx->stableIn_notConsumed",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x6924,
                          "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                         );
          }
          input->pos = sVar13;
          cctx->stableIn_notConsumed = 0;
        }
        sVar7 = output->pos;
        while( true ) {
          local_78 = ZSTDMT_compressStream_generic(cctx->mtctx,output,input,endOp);
          sVar4 = input->pos;
          cctx->consumedSrcSize = cctx->consumedSrcSize + (sVar4 - sVar13);
          sVar5 = output->pos;
          cctx->producedCSize = cctx->producedCSize + (sVar5 - sVar7);
          if (0xffffffffffffff88 < local_78) {
            cctx->streamStage = zcss_init;
            cctx->pledgedSrcSizePlusOne = 0;
            return local_78;
          }
          if (local_78 == 0 && endOp == ZSTD_e_end) break;
          if (endOp == ZSTD_e_continue) {
            if ((((sVar4 != sVar13) || (sVar5 != sVar7)) || (sVar13 == input->size)) ||
               (bVar15 = sVar7 == output->size, sVar7 = sVar5, sVar13 = sVar4, bVar15))
            goto LAB_00195ef3;
          }
          else if ((local_78 == 0) || (sVar7 = sVar5, sVar13 = sVar4, sVar5 == output->size))
          goto LAB_00195ef3;
        }
        cctx->streamStage = zcss_init;
        cctx->pledgedSrcSizePlusOne = 0;
LAB_00195ef3:
        ZSTD_setBufferExpectations(cctx,output,input);
      }
    }
    else {
      sStack_90 = 0xffffffffffffffd6;
      local_78 = sStack_90;
    }
  }
  return local_78;
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    RETURN_ERROR_IF(output->pos > output->size, dstSize_tooSmall, "invalid output buffer");
    RETURN_ERROR_IF(input->pos  > input->size, srcSize_wrong, "invalid input buffer");
    RETURN_ERROR_IF((U32)endOp > (U32)ZSTD_e_end, parameter_outOfBound, "invalid endDirective");
    assert(cctx != NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        size_t const inputSize = input->size - input->pos;  /* no obligation to start from pos==0 */
        size_t const totalInputSize = inputSize + cctx->stableIn_notConsumed;
        if ( (cctx->requestedParams.inBufferMode == ZSTD_bm_stable) /* input is presumed stable, across invocations */
          && (endOp == ZSTD_e_continue)                             /* no flush requested, more input to come */
          && (totalInputSize < ZSTD_BLOCKSIZE_MAX) ) {              /* not even reached one block yet */
            if (cctx->stableIn_notConsumed) {  /* not the first time */
                /* check stable source guarantees */
                RETURN_ERROR_IF(input->src != cctx->expectedInBuffer.src, stabilityCondition_notRespected, "stableInBuffer condition not respected: wrong src pointer");
                RETURN_ERROR_IF(input->pos != cctx->expectedInBuffer.size, stabilityCondition_notRespected, "stableInBuffer condition not respected: externally modified pos");
            }
            /* pretend input was consumed, to give a sense forward progress */
            input->pos = input->size;
            /* save stable inBuffer, for later control, and flush/end */
            cctx->expectedInBuffer = *input;
            /* but actually input wasn't consumed, so keep track of position from where compression shall resume */
            cctx->stableIn_notConsumed += inputSize;
            /* don't initialize yet, wait for the first block of flush() order, for better parameters adaptation */
            return ZSTD_FRAMEHEADERSIZE_MIN(cctx->requestedParams.format);  /* at least some header to produce */
        }
        FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, endOp, totalInputSize), "compressStream2 initialization failed");
        ZSTD_setBufferExpectations(cctx, output, input);   /* Set initial buffer expectations now that we've initialized */
    }
    /* end of transparent initialization stage */

    FORWARD_IF_ERROR(ZSTD_checkBufferStability(cctx, output, input, endOp), "invalid buffers");
    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        size_t flushMin;
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        if (cctx->stableIn_notConsumed) {
            assert(cctx->appliedParams.inBufferMode == ZSTD_bm_stable);
            /* some early data was skipped - make it available for consumption */
            assert(input->pos >= cctx->stableIn_notConsumed);
            input->pos -= cctx->stableIn_notConsumed;
            cctx->stableIn_notConsumed = 0;
        }
        for (;;) {
            size_t const ipos = input->pos;
            size_t const opos = output->pos;
            flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            cctx->consumedSrcSize += (U64)(input->pos - ipos);
            cctx->producedCSize += (U64)(output->pos - opos);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                if (flushMin == 0)
                    ZSTD_CCtx_trace(cctx, 0);
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            FORWARD_IF_ERROR(flushMin, "ZSTDMT_compressStream_generic failed");

            if (endOp == ZSTD_e_continue) {
                /* We only require some progress with ZSTD_e_continue, not maximal progress.
                 * We're done if we've consumed or produced any bytes, or either buffer is
                 * full.
                 */
                if (input->pos != ipos || output->pos != opos || input->pos == input->size || output->pos == output->size)
                    break;
            } else {
                assert(endOp == ZSTD_e_flush || endOp == ZSTD_e_end);
                /* We require maximal progress. We're done when the flush is complete or the
                 * output buffer is full.
                 */
                if (flushMin == 0 || output->pos == output->size)
                    break;
            }
        }
        DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
        /* Either we don't require maximum forward progress, we've finished the
         * flush, or we are out of output space.
         */
        assert(endOp == ZSTD_e_continue || flushMin == 0 || output->pos == output->size);
        ZSTD_setBufferExpectations(cctx, output, input);
        return flushMin;
    }
#endif /* ZSTD_MULTITHREAD */
    FORWARD_IF_ERROR( ZSTD_compressStream_generic(cctx, output, input, endOp) , "");
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    ZSTD_setBufferExpectations(cctx, output, input);
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}